

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  alpha_cluster *paVar5;
  uchar *puVar6;
  color_quad_u8 (*pacVar7) [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  byte bVar12;
  bool bVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  uint p;
  long lVar23;
  uint8 t;
  uint uVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  vector<unsigned_char> selectors;
  results results;
  results refinerResults;
  params local_560;
  params local_540;
  uint block_values [8];
  dxt_endpoint_refiner refiner;
  uint alpha_values [8];
  uint encoding_weight [8];
  dxt5_endpoint_optimizer optimizer;
  
  uVar2 = this->m_pTask_pool->m_num_threads;
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&optimizer);
  dxt_endpoint_refiner::dxt_endpoint_refiner(&refiner);
  selectors.m_p = (uchar *)0x0;
  selectors.m_size = 0;
  selectors.m_capacity = 0;
  do {
    uVar28 = (uint)data;
    if ((this->m_alpha_clusters).m_size <= uVar28) {
      vector<unsigned_char>::~vector(&selectors);
      dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&optimizer);
      return;
    }
    uVar29 = data & 0xffffffff;
    paVar5 = (this->m_alpha_clusters).m_p;
    uVar24 = paVar5[uVar29].pixels.m_size;
    if (uVar24 != 0) {
      local_560.m_block_index = 0;
      local_560.m_pPixels = paVar5[uVar29].pixels.m_p;
      local_560.m_comp_index = 0;
      local_560.m_quality = cCRNDXTQualityUber;
      local_560.m_use_both_block_types = false;
      local_560.m_num_pixels = uVar24;
      vector<unsigned_char>::resize(&selectors,uVar24,false);
      results.m_pSelectors = selectors.m_p;
      dxt5_endpoint_optimizer::compute(&optimizer,&local_560,&results);
      paVar5[uVar29].first_endpoint = (uint)results.m_first_endpoint;
      paVar5[uVar29].second_endpoint = (uint)results.m_second_endpoint;
      dxt5_block::get_block_values
                (block_values,(uint)results.m_first_endpoint,(uint)results.m_second_endpoint);
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        uVar24 = block_values[(byte)(&g_dxt5_from_linear)[lVar14]];
        paVar5[uVar29].alpha_values[lVar14] = uVar24;
        alpha_values[lVar14] = uVar24;
      }
      iVar20 = paVar5[uVar29].first_endpoint - paVar5[uVar29].second_endpoint;
      uVar16 = (uint)(iVar20 * iVar20) >> 3;
      if (0x7ff < uVar16) {
        uVar16 = 0x800;
      }
      if ((uint)(iVar20 * iVar20) < 8) {
        uVar16 = 1;
      }
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        encoding_weight[lVar14] =
             (uint)(long)((((float)(int)lVar14 / 7.0) * -0.14999998 + 1.15) * (float)uVar16);
      }
      bVar13 = this->m_has_etc_color_blocks;
      if (bVar13 != false) {
        uVar16 = 1;
        if ((6 < iVar20) && (uVar16 = (iVar20 + 0xcU) / 0x12, 0xe < uVar16)) {
          uVar16 = 0xf;
        }
        uVar17 = (uint)results.m_first_endpoint + (uint)results.m_second_endpoint + 1 >> 1 & 0xff;
        for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
          uVar24 = determine_alpha_endpoint_codebook_task::stripped_modifier_table[iVar20 < 7]
                   [lVar14] * uVar16 + uVar17;
          if (0xfe < (int)uVar24) {
            uVar24 = 0xff;
          }
          if ((int)uVar24 < 1) {
            uVar24 = 0;
          }
          paVar5[uVar29].alpha_values[lVar14] = uVar24;
          alpha_values[lVar14] = uVar24;
        }
        paVar5[uVar29].first_endpoint = uVar17;
        paVar5[uVar29].second_endpoint = uVar16 << 4 | (uint)(iVar20 < 7) * 2 + 0xb;
      }
      uVar16 = this->m_num_alpha_blocks;
      uVar18 = 0;
      while (uVar18 != uVar16) {
        uVar17 = (this->m_params).m_alpha_component_indices[uVar18];
        uVar15 = uVar18 + 1;
        lVar11 = uVar18 + 1;
        uVar3 = paVar5[uVar29].blocks[uVar18 + 1].m_size;
        puVar6 = (this->m_block_encodings).m_p;
        bVar1 = this->m_has_subblocks;
        pacVar7 = this->m_blocks;
        lVar14 = uVar18 + 1;
        for (uVar19 = 0; uVar18 = uVar15, uVar19 != uVar3; uVar19 = uVar19 + 1) {
          uVar4 = paVar5[uVar29].blocks[lVar11].m_p[uVar19];
          uVar18 = 0;
          for (lVar23 = 0; lVar23 != 0x10; lVar23 = lVar23 + 1) {
            uVar27 = 0xffffffff;
            uVar21 = 0;
            for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
              if (bVar13 == false) {
                bVar12 = 7 - *(byte *)((long)&g_dxt5_to_linear + lVar25);
                if ((results.m_reordered & 1U) == 0) {
                  bVar12 = *(byte *)((long)&g_dxt5_to_linear + lVar25);
                }
              }
              else {
                bVar12 = (byte)lVar25;
              }
              uVar26 = (uint)pacVar7[uVar4 >> (bVar1 & 0x1fU)][lVar23].field_0.c[uVar17] -
                       alpha_values[bVar12];
              uVar22 = -uVar26;
              if (0 < (int)uVar26) {
                uVar22 = uVar26;
              }
              if (uVar22 < uVar27) {
                uVar21 = (ulong)bVar12;
                uVar27 = uVar22;
              }
            }
            uVar18 = uVar18 << 3 | uVar21;
          }
          this->m_block_selectors[lVar14].m_p[uVar4] =
               uVar18 << 0x10 | (ulong)encoding_weight[puVar6[uVar4]];
        }
      }
      local_540.m_alpha_comp_index = 0;
      local_540.m_highest_quality = true;
      local_540.m_perceptual = (this->m_params).m_perceptual;
      local_540.m_pSelectors = selectors.m_p;
      local_540.m_pPixels = paVar5[uVar29].pixels.m_p;
      local_540.m_num_pixels = paVar5[uVar29].pixels.m_size;
      local_540.m_dxt1_selectors = false;
      local_540.m_error_to_beat = results.m_error;
      local_540.m_block_index = uVar28;
      if (bVar13 == false) {
        bVar13 = dxt_endpoint_refiner::refine(&refiner,&local_540,&refinerResults);
        paVar5[uVar29].refined_alpha = bVar13;
        if (bVar13) {
          paVar5[uVar29].first_endpoint = (uint)refinerResults.m_low_color;
          paVar5[uVar29].second_endpoint = (uint)refinerResults.m_high_color;
          dxt5_block::get_block_values
                    (block_values,(uint)refinerResults.m_low_color,(uint)refinerResults.m_high_color
                    );
          for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
            paVar5[uVar29].refined_alpha_values[lVar14] =
                 block_values[(byte)(&g_dxt5_from_linear)[lVar14]];
          }
          goto LAB_00162f87;
        }
      }
      else {
        paVar5[uVar29].refined_alpha = false;
      }
      uVar8 = *(undefined8 *)paVar5[uVar29].alpha_values;
      uVar9 = *(undefined8 *)(paVar5[uVar29].alpha_values + 2);
      uVar10 = *(undefined8 *)(paVar5[uVar29].alpha_values + 6);
      *(undefined8 *)(paVar5[uVar29].refined_alpha_values + 4) =
           *(undefined8 *)(paVar5[uVar29].alpha_values + 4);
      *(undefined8 *)(paVar5[uVar29].refined_alpha_values + 6) = uVar10;
      *(undefined8 *)paVar5[uVar29].refined_alpha_values = uVar8;
      *(undefined8 *)(paVar5[uVar29].refined_alpha_values + 2) = uVar9;
    }
LAB_00162f87:
    data = (uint64)(uVar28 + uVar2 + 1);
  } while( true );
}

Assistant:

void dxt_hc::determine_alpha_endpoint_codebook_task(uint64 data, void*)
    {
        const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        dxt5_endpoint_optimizer optimizer;
        dxt_endpoint_refiner refiner;
        crnlib::vector<uint8> selectors;

        for (uint cluster_index = (uint)data; cluster_index < m_alpha_clusters.size(); cluster_index += num_tasks)
        {
            alpha_cluster& cluster = m_alpha_clusters[cluster_index];
            if (cluster.pixels.empty())
            {
                continue;
            }

            dxt5_endpoint_optimizer::params params;
            params.m_pPixels = cluster.pixels.get_ptr();
            params.m_num_pixels = cluster.pixels.size();
            params.m_comp_index = 0;
            params.m_quality = cCRNDXTQualityUber;
            params.m_use_both_block_types = false;

            dxt5_endpoint_optimizer::results results;
            selectors.resize(params.m_num_pixels);
            results.m_pSelectors = selectors.get_ptr();

            optimizer.compute(params, results);
            cluster.first_endpoint = results.m_first_endpoint;
            cluster.second_endpoint = results.m_second_endpoint;
            uint block_values[8], alpha_values[8];
            dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
            for (uint i = 0; i < 8; i++)
            {
                alpha_values[i] = cluster.alpha_values[i] = block_values[g_dxt5_from_linear[i]];
            }
            int delta = cluster.first_endpoint - cluster.second_endpoint;
            uint encoding_weight[8];
            for (uint endpoint_weight = math::clamp<uint>(delta * delta >> 3, 1, 2048), i = 0; i < 8; i++)
            {
                encoding_weight[i] = (uint)(endpoint_weight * math::lerp(1.15f, 1.0f, i / 7.0f));
            }

            if (m_has_etc_color_blocks)
            {
                static const int stripped_modifier_table[2][8] = {
                    { -10, -7, -5, -2, 1, 4, 6, 9 },
                    { -10, -3, -2, -1, 0, 1, 2, 9 }
                };
                int base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
                int modifier_index = delta <= 6 ? 13 : 11;
                int multiplier = delta <= 6 ? 1 : math::clamp<int>((delta + 12) / 18, 1, 15);
                const int* modifier = stripped_modifier_table[modifier_index == 11 ? 0 : 1];
                for (int i = 0; i < 8; i++)
                {
                    alpha_values[i] = cluster.alpha_values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
                }
                cluster.first_endpoint = base_codeword;
                cluster.second_endpoint = multiplier << 4 | modifier_index;
            }

            for (uint a = 0; a < m_num_alpha_blocks; a++)
            {
                uint component_index = m_params.m_alpha_component_indices[a];
                crnlib::vector<uint>& blocks = cluster.blocks[cAlpha0 + a];
                for (uint i = 0; i < blocks.size(); i++)
                {
                    uint b = blocks[i];
                    uint weight = encoding_weight[m_block_encodings[b]];
                    uint64 selector = 0;
                    for (uint p = 0; p < 16; p++)
                    {
                        uint error_best = cUINT32_MAX;
                        uint8 s_best = 0;
                        for (uint8 t = 0; t < 8; t++)
                        {
                            uint8 s = m_has_etc_color_blocks ? t : results.m_reordered ? 7 - g_dxt5_to_linear[t]
                                                                                       : g_dxt5_to_linear[t];
                            int delta = m_blocks[m_has_subblocks ? b >> 1 : b][p][component_index] - alpha_values[s];
                            uint error = delta >= 0 ? delta : -delta;
                            if (error < error_best)
                            {
                                s_best = s;
                                error_best = error;
                            }
                        }
                        selector = selector << 3 | s_best;
                    }
                    m_block_selectors[cAlpha0 + a][b] = selector << 16 | weight;
                }
            }

            dxt_endpoint_refiner::params refinerParams;
            dxt_endpoint_refiner::results refinerResults;
            refinerParams.m_perceptual = m_params.m_perceptual;
            refinerParams.m_pSelectors = selectors.get_ptr();
            refinerParams.m_pPixels = cluster.pixels.get_ptr();
            refinerParams.m_num_pixels = cluster.pixels.size();
            refinerParams.m_dxt1_selectors = false;
            refinerParams.m_error_to_beat = results.m_error;
            refinerParams.m_block_index = cluster_index;
            cluster.refined_alpha = !m_has_etc_color_blocks && refiner.refine(refinerParams, refinerResults);
            if (cluster.refined_alpha)
            {
                cluster.first_endpoint = refinerResults.m_low_color;
                cluster.second_endpoint = refinerResults.m_high_color;
                dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
                for (uint i = 0; i < 8; i++)
                {
                    cluster.refined_alpha_values[i] = block_values[g_dxt5_from_linear[i]];
                }
            }
            else
            {
                memcpy(cluster.refined_alpha_values, cluster.alpha_values, sizeof(cluster.refined_alpha_values));
            }
        }
    }